

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<int>(string *__return_storage_ptr__,int *arg)

{
  std::__cxx11::to_string(__return_storage_ptr__,*arg);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg)
{
    return std::to_string(arg);
}